

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnndec.c
# Opt level: O2

char * rnndec_decodeval(rnndeccontext *ctx,rnntypeinfo *ti,uint64_t value,int width)

{
  rnnbitfield **pprVar1;
  rnnbitfield *prVar2;
  rnnvalue **pprVar3;
  rnnvalue *prVar4;
  envy_colors *peVar5;
  int iVar6;
  int iVar7;
  rnnbitfield ***ppprVar8;
  char *pcVar9;
  rnnvalue ***ppprVar10;
  byte bVar11;
  uint uVar12;
  long lVar13;
  char *pcVar14;
  ulong uVar15;
  char **__ptr;
  float fVar16;
  int *piVar17;
  char *__fmt;
  char *pcVar18;
  uint uVar19;
  ulong uVar20;
  float fVar21;
  ulong uVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  char *res;
  ulong local_40;
  char *tmp;
  
code_r0x00107ea8:
  uVar22 = value >> 0x20;
  res = (char *)0x0;
  if (ti != (rnntypeinfo *)0x0) {
    iVar7 = ti->shr;
    uVar20 = value << ((byte)iVar7 & 0x3f);
    uVar22 = uVar20;
    if (iVar7 == 0) {
      uVar22 = value;
    }
    iVar6 = (int)(uVar20 >> 0x20);
    if (iVar7 == 0) {
      iVar6 = (int)(value >> 0x20);
    }
    lVar13 = (long)ti->add;
    uVar20 = (uVar22 & 0xffffffff) + lVar13;
    uVar15 = uVar20;
    if (lVar13 == 0) {
      uVar15 = uVar22;
    }
    value = uVar15 & 0xffffffff;
    iVar7 = (int)(uVar20 >> 0x20);
    if (lVar13 == 0) {
      iVar7 = 0;
    }
    uVar22 = (ulong)(uint)(iVar7 + iVar6);
    fVar21 = (float)uVar15;
    bVar11 = (byte)width;
    switch(ti->type) {
    case RNN_TTYPE_INLINE_ENUM:
      ppprVar10 = &ti->vals;
      piVar17 = &ti->valsnum;
      break;
    case RNN_TTYPE_INLINE_BITSET:
      ppprVar8 = &ti->bitfields;
      piVar17 = &ti->bitfieldsnum;
      goto LAB_00107fca;
    case RNN_TTYPE_ENUM:
      ppprVar10 = &ti->eenum->vals;
      piVar17 = &ti->eenum->valsnum;
      break;
    case RNN_TTYPE_BITSET:
      ppprVar8 = &ti->ebitset->bitfields;
      piVar17 = &ti->ebitset->bitfieldsnum;
LAB_00107fca:
      pprVar1 = *ppprVar8;
      local_40 = value | uVar22 << 0x20;
      uVar12 = *piVar17;
      if (*piVar17 < 1) {
        uVar12 = 0;
      }
      uVar20 = 0;
      uVar22 = 0;
      goto LAB_00107fed;
    case RNN_TTYPE_SPECTYPE:
      goto switchD_00107f29_caseD_4;
    default:
      goto switchD_00107f29_caseD_5;
    case RNN_TTYPE_INT:
      uVar22 = value | uVar22 << 0x20;
      peVar5 = ctx->colors;
      if ((uVar22 >> ((ulong)(byte)(bVar11 - 1) & 0x3f) & 1) == 0) {
        pcVar9 = peVar5->reset;
        pcVar18 = "%s%li%s";
      }
      else {
        uVar22 = (1L << (bVar11 & 0x3f)) - uVar22;
        pcVar9 = peVar5->reset;
        pcVar18 = "%s-%li%s";
      }
      asprintf(&res,pcVar18,peVar5->num,uVar22,pcVar9);
      return res;
    case RNN_TTYPE_UINT:
      pcVar9 = ctx->colors->reset;
      pcVar18 = ctx->colors->num;
      pcVar14 = (char *)(value | uVar22 << 0x20);
      __fmt = "%s%lu%s";
      goto LAB_00108210;
    case RNN_TTYPE_FLOAT:
switchD_00107f29_caseD_8:
      if (width == 0x10) {
        pcVar9 = ctx->colors->num;
        fVar16 = (float)(((uint)fVar21 & 0x8000) * 0x10000);
        uVar12 = (uint)(value >> 10) & 0x1f;
        if (uVar12 == 0x1f) {
          fVar16 = (float)((int)fVar16 + ((uint)fVar21 & 0x3ff) * 0x2000 + 0x7f800000);
        }
        else {
          uVar19 = (uint)fVar21 & 0x3ff;
          if ((value >> 10 & 0x1f) != 0) goto LAB_001084b2;
          if ((uVar15 & 0x3ff) != 0) {
            uVar12 = 0x1f;
            if ((uVar15 & 0x3ff) != 0) {
              for (; uVar19 >> uVar12 == 0; uVar12 = uVar12 - 1) {
              }
            }
            uVar19 = (int)fVar21 << ((char)(uVar12 ^ 0x1f) - 0x15U & 0x1f) & 0x3ff;
            uVar12 = 0x16 - (uVar12 ^ 0x1f);
LAB_001084b2:
            fVar16 = (float)((uint)fVar16 | uVar12 * 0x800000 + uVar19 * 0x2000 + 0x38000000);
          }
        }
        dVar23 = (double)fVar16;
        pcVar18 = ctx->colors->reset;
LAB_001084e3:
        asprintf(&res,"%s%f%s",dVar23,pcVar9,pcVar18);
        return res;
      }
      if (width == 0x20) {
        pcVar18 = ctx->colors->reset;
        pcVar9 = ctx->colors->num;
        dVar23 = (double)fVar21;
        goto LAB_001084e3;
      }
      if (width == 0x40) {
        pcVar18 = ctx->colors->reset;
        pcVar9 = ctx->colors->num;
        dVar23 = (double)(value | uVar22 << 0x20);
        goto LAB_001084e3;
      }
      goto switchD_00107f29_caseD_5;
    case RNN_TTYPE_BOOLEAN:
      uVar20 = value | uVar22 << 0x20;
      if (uVar20 == 1) {
        pcVar9 = ctx->colors->reset;
        pcVar18 = ctx->colors->eval;
        pcVar14 = "%sTRUE%s";
      }
      else {
        if (uVar20 != 0) goto switchD_00107f29_caseD_8;
        pcVar9 = ctx->colors->reset;
        pcVar18 = ctx->colors->eval;
        pcVar14 = "%sFALSE%s";
      }
      __ptr = &res;
      asprintf(__ptr,pcVar14,pcVar18,pcVar9);
      goto LAB_0010821f;
    case RNN_TTYPE_FIXED:
      uVar22 = value | uVar22 << 0x20;
      if ((uVar22 >> ((ulong)(byte)(bVar11 - 1) & 0x3f) & 1) == 0) goto LAB_00108324;
      pcVar9 = ctx->colors->reset;
      pcVar18 = ctx->colors->num;
      lVar13 = (1L << (bVar11 & 0x3f)) - uVar22;
      auVar24._8_4_ = (int)((ulong)lVar13 >> 0x20);
      auVar24._0_8_ = lVar13;
      auVar24._12_4_ = 0x45300000;
      dVar23 = ((auVar24._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar13) - 4503599627370496.0)) /
               (double)(1 << ((byte)ti->radix & 0x1f));
      pcVar14 = "%s-%lf%s (%08lx)";
      goto LAB_00108367;
    case RNN_TTYPE_UFIXED:
      uVar22 = value | uVar22 << 0x20;
LAB_00108324:
      pcVar9 = ctx->colors->reset;
      pcVar18 = ctx->colors->num;
      auVar25._8_4_ = (int)(uVar22 >> 0x20);
      auVar25._0_8_ = uVar22;
      auVar25._12_4_ = 0x45300000;
      dVar23 = ((auVar25._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar22) - 4503599627370496.0)) /
               (double)(1 << ((byte)ti->radix & 0x1f));
      pcVar14 = "%s%lf%s (%08lx)";
LAB_00108367:
      __ptr = &res;
      asprintf(__ptr,pcVar14,dVar23,pcVar18,pcVar9);
      goto LAB_0010821f;
    }
    pprVar3 = *ppprVar10;
    local_40 = value | uVar22 << 0x20;
    uVar15 = 0;
    uVar20 = (ulong)(uint)*piVar17;
    if (*piVar17 < 1) {
      uVar20 = uVar15;
    }
    goto LAB_001081bb;
  }
  goto switchD_00107f29_caseD_5;
switchD_00107f29_caseD_4:
  ti = &ti->spectype->typeinfo;
  value = value | uVar22 << 0x20;
  goto code_r0x00107ea8;
LAB_00107fed:
  if (uVar12 == uVar20) goto LAB_00108135;
  iVar7 = rnndec_varmatch(ctx,&pprVar1[uVar20]->varinfo);
  if (iVar7 != 0) {
    prVar2 = pprVar1[uVar20];
    uVar15 = (prVar2->mask & local_40) >> ((byte)prVar2->low & 0x3f);
    uVar22 = uVar22 | prVar2->mask;
    if ((prVar2->typeinfo).type == RNN_TTYPE_BOOLEAN) {
      if (uVar15 != 0) {
        if (uVar15 != 1) goto LAB_00108086;
        if (res == (char *)0x0) {
          asprintf(&res,"%s%s%s",ctx->colors->mod,prVar2->name,ctx->colors->reset);
        }
        else {
          asprintf(&tmp,"%s | %s%s%s");
          free(res);
          res = tmp;
        }
      }
    }
    else {
LAB_00108086:
      pcVar9 = rnndec_decodeval(ctx,&prVar2->typeinfo,uVar15,(prVar2->high - prVar2->low) + 1);
      if (res == (char *)0x0) {
        asprintf(&res,"%s%s%s = %s",ctx->colors->rname,pprVar1[uVar20]->name,ctx->colors->reset,
                 pcVar9);
      }
      else {
        asprintf(&tmp,"%s | %s%s%s = %s");
        free(res);
        res = tmp;
      }
      free(pcVar9);
    }
  }
  uVar20 = uVar20 + 1;
  goto LAB_00107fed;
LAB_00108135:
  local_40 = local_40 & ~uVar22;
  if (local_40 != 0) {
    pcVar9 = ctx->colors->err;
    if (res == (char *)0x0) {
      asprintf(&res,"%s%#lx%s",pcVar9,local_40,ctx->colors->reset);
    }
    else {
      asprintf(&tmp,"%s | %s%#lx%s",res,pcVar9,local_40);
      free(res);
      res = tmp;
    }
  }
  if (res == (char *)0x0) {
    asprintf(&res,"%s0%s",ctx->colors->num,ctx->colors->reset);
  }
  __ptr = &tmp;
  asprintf(__ptr,"{ %s }",res);
  free(res);
  goto LAB_0010821f;
LAB_001081bb:
  if (uVar20 == uVar15) goto switchD_00107f29_caseD_5;
  iVar7 = rnndec_varmatch(ctx,&pprVar3[uVar15]->varinfo);
  if (((iVar7 != 0) && (prVar4 = pprVar3[uVar15], prVar4->valvalid != 0)) &&
     (prVar4->value == local_40)) {
    pcVar9 = ctx->colors->reset;
    pcVar18 = ctx->colors->eval;
    pcVar14 = prVar4->name;
    __fmt = "%s%s%s";
    goto LAB_00108210;
  }
  uVar15 = uVar15 + 1;
  goto LAB_001081bb;
switchD_00107f29_caseD_5:
  pcVar9 = ctx->colors->reset;
  pcVar18 = ctx->colors->num;
  pcVar14 = (char *)(value & 0xffffffff | uVar22 << 0x20);
  __fmt = "%s%#lx%s";
LAB_00108210:
  __ptr = &res;
  asprintf(__ptr,__fmt,pcVar18,pcVar14,pcVar9);
LAB_0010821f:
  return *__ptr;
}

Assistant:

char *rnndec_decodeval(struct rnndeccontext *ctx, struct rnntypeinfo *ti, uint64_t value, int width) {
	char *res = 0;
	int i;
	struct rnnvalue **vals;
	int valsnum;
	struct rnnbitfield **bitfields;
	int bitfieldsnum;
	char *tmp;
	uint64_t mask;
	if (!ti)
		goto failhex;
	if (ti->shr) value <<= ti->shr;
	if (ti->add) value += ti->add;
	switch (ti->type) {
		case RNN_TTYPE_ENUM:
			vals = ti->eenum->vals;
			valsnum = ti->eenum->valsnum;
			goto doenum;
		case RNN_TTYPE_INLINE_ENUM:
			vals = ti->vals;
			valsnum = ti->valsnum;
			goto doenum;
		doenum:
			for (i = 0; i < valsnum; i++)
				if (rnndec_varmatch(ctx, &vals[i]->varinfo) && vals[i]->valvalid && vals[i]->value == value) {
					asprintf (&res, "%s%s%s", ctx->colors->eval, vals[i]->name, ctx->colors->reset);
					return res;
				}
			goto failhex;
		case RNN_TTYPE_BITSET:
			bitfields = ti->ebitset->bitfields;
			bitfieldsnum = ti->ebitset->bitfieldsnum;
			goto dobitset;
		case RNN_TTYPE_INLINE_BITSET:
			bitfields = ti->bitfields;
			bitfieldsnum = ti->bitfieldsnum;
			goto dobitset;
		dobitset:
			mask = 0;
			for (i = 0; i < bitfieldsnum; i++) {
				if (!rnndec_varmatch(ctx, &bitfields[i]->varinfo))
					continue;
				uint64_t sval = (value & bitfields[i]->mask) >> bitfields[i]->low;
				mask |= bitfields[i]->mask;
				if (bitfields[i]->typeinfo.type == RNN_TTYPE_BOOLEAN) {
					if (sval == 0)
						continue;
					else if (sval == 1) {
						if (!res)
							asprintf (&res, "%s%s%s", ctx->colors->mod, bitfields[i]->name, ctx->colors->reset);
						else {
							asprintf (&tmp, "%s | %s%s%s", res, ctx->colors->mod, bitfields[i]->name, ctx->colors->reset);
							free(res);
							res = tmp;
						}
						continue;
					}
				}
				char *subval = rnndec_decodeval(ctx, &bitfields[i]->typeinfo, sval, bitfields[i]->high - bitfields[i]->low + 1);
				if (!res)
					asprintf (&res, "%s%s%s = %s", ctx->colors->rname, bitfields[i]->name, ctx->colors->reset, subval);
				else {
					asprintf (&tmp, "%s | %s%s%s = %s", res, ctx->colors->rname, bitfields[i]->name, ctx->colors->reset, subval);
					free(res);
					res = tmp;
				}
				free(subval);
			}
			if (value & ~mask) {
				if (!res)
					asprintf (&res, "%s%#"PRIx64"%s", ctx->colors->err, value & ~mask, ctx->colors->reset);
				else {
					asprintf (&tmp, "%s | %s%#"PRIx64"%s", res, ctx->colors->err, value & ~mask, ctx->colors->reset);
					free(res);
					res = tmp;
				}
			}
			if (!res)
				asprintf (&res, "%s0%s", ctx->colors->num, ctx->colors->reset);
			asprintf (&tmp, "{ %s }", res);
			free(res);
			return tmp;
		case RNN_TTYPE_SPECTYPE:
			return rnndec_decodeval(ctx, &ti->spectype->typeinfo, value, width);
		case RNN_TTYPE_HEX:
			asprintf (&res, "%s%#"PRIx64"%s", ctx->colors->num, value, ctx->colors->reset);
			return res;
		case RNN_TTYPE_FIXED:
			if (value & UINT64_C(1) << (width-1)) {
				asprintf (&res, "%s-%lf%s (%08"PRIx64")", ctx->colors->num,
						((double)((UINT64_C(1) << width) - value)) / ((double)(1 << ti->radix)),
						ctx->colors->reset, value);
				return res;
			}
			/* fallthrough */
		case RNN_TTYPE_UFIXED:
			asprintf (&res, "%s%lf%s (%08"PRIx64")", ctx->colors->num,
					((double)value) / ((double)(1 << ti->radix)),
					ctx->colors->reset, value);
			return res;
		case RNN_TTYPE_UINT:
			asprintf (&res, "%s%"PRIu64"%s", ctx->colors->num, value, ctx->colors->reset);
			return res;
		case RNN_TTYPE_INT:
			if (value & UINT64_C(1) << (width-1))
				asprintf (&res, "%s-%"PRIi64"%s", ctx->colors->num, (UINT64_C(1) << width) - value, ctx->colors->reset);
			else
				asprintf (&res, "%s%"PRIi64"%s", ctx->colors->num, value, ctx->colors->reset);
			return res;
		case RNN_TTYPE_BOOLEAN:
			if (value == 0) {
				asprintf (&res, "%sFALSE%s", ctx->colors->eval, ctx->colors->reset);
				return res;
			} else if (value == 1) {
				asprintf (&res, "%sTRUE%s", ctx->colors->eval, ctx->colors->reset);
				return res;
			}
		case RNN_TTYPE_FLOAT: {
			union { uint64_t i; float f; double d; } val;
			val.i = value;
			if (width == 64)
				asprintf(&res, "%s%f%s", ctx->colors->num,
					val.d, ctx->colors->reset);
			else if (width == 32)
				asprintf(&res, "%s%f%s", ctx->colors->num,
					val.f, ctx->colors->reset);
			else if (width == 16)
				asprintf(&res, "%s%f%s", ctx->colors->num,
					float16(value), ctx->colors->reset);
			else
				goto failhex;

			return res;
		}
		failhex:
		default:
			asprintf (&res, "%s%#"PRIx64"%s", ctx->colors->num, value, ctx->colors->reset);
			return res;
			break;
	}
}